

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeRecordUnpack(KeyInfo *pKeyInfo,int nKey,void *pKey,UnpackedRecord *p)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  u32 uVar4;
  u16 uVar5;
  uint uVar6;
  Mem *pMem;
  uint uVar7;
  uint uVar8;
  u32 local_4c;
  UnpackedRecord *local_48;
  KeyInfo *local_40;
  uint local_34;
  
  pMem = p->aMem;
  p->default_rc = '\0';
  local_48 = p;
  local_40 = pKeyInfo;
  if (*pKey < '\0') {
    bVar2 = sqlite3GetVarint32((uchar *)pKey,&local_34);
    uVar6 = (uint)bVar2;
    uVar8 = local_34;
  }
  else {
    uVar6 = 1;
    uVar8 = (int)*pKey;
  }
  uVar5 = 0;
  uVar7 = uVar8;
  do {
    if ((uVar8 <= uVar6) || (nKey < (int)uVar7)) break;
    cVar1 = *(char *)((long)pKey + (ulong)uVar6);
    if (cVar1 < '\0') {
      bVar2 = sqlite3GetVarint32((uchar *)((ulong)uVar6 + (long)pKey),&local_4c);
      uVar3 = (uint)bVar2;
      uVar4 = local_4c;
    }
    else {
      uVar3 = 1;
      uVar4 = (int)cVar1;
    }
    pMem->enc = local_40->enc;
    pMem->db = local_40->db;
    pMem->szMalloc = 0;
    pMem->z = (char *)0x0;
    uVar6 = uVar6 + uVar3;
    uVar4 = sqlite3VdbeSerialGet((uchar *)((long)(int)uVar7 + (long)pKey),uVar4,pMem);
    uVar7 = uVar7 + uVar4;
    pMem = pMem + 1;
    uVar5 = uVar5 + 1;
  } while (uVar5 < local_48->nField);
  local_48->nField = uVar5;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeRecordUnpack(
  KeyInfo *pKeyInfo,     /* Information about the record format */
  int nKey,              /* Size of the binary record */
  const void *pKey,      /* The binary record */
  UnpackedRecord *p      /* Populate this structure before returning. */
){
  const unsigned char *aKey = (const unsigned char *)pKey;
  int d; 
  u32 idx;                        /* Offset in aKey[] to read from */
  u16 u;                          /* Unsigned loop counter */
  u32 szHdr;
  Mem *pMem = p->aMem;

  p->default_rc = 0;
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  idx = getVarint32(aKey, szHdr);
  d = szHdr;
  u = 0;
  while( idx<szHdr && d<=nKey ){
    u32 serial_type;

    idx += getVarint32(&aKey[idx], serial_type);
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    /* pMem->flags = 0; // sqlite3VdbeSerialGet() will set this for us */
    pMem->szMalloc = 0;
    pMem->z = 0;
    d += sqlite3VdbeSerialGet(&aKey[d], serial_type, pMem);
    pMem++;
    if( (++u)>=p->nField ) break;
  }
  assert( u<=pKeyInfo->nField + 1 );
  p->nField = u;
}